

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsd_symbol.cpp
# Opt level: O0

void __thiscall DSDcc::DSDSymbol::noCarrier(DSDSymbol *this)

{
  DSDSymbol *in_RDI;
  
  resetSymbol(in_RDI);
  resetZeroCrossing(in_RDI);
  in_RDI->m_max = 0;
  in_RDI->m_min = 0;
  in_RDI->m_center = 0;
  in_RDI->m_filteredSample = 0;
  return;
}

Assistant:

void DSDSymbol::noCarrier()
{
    resetSymbol();
    resetZeroCrossing();
    m_max = 0;
    m_min = 0;
    m_center = 0;
    m_filteredSample = 0;
}